

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Name __thiscall
ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::removeAt
          (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this,size_t index)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_t sVar3;
  char *pcVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  Name NVar8;
  
  uVar6 = this->usedElements;
  if (index < uVar6) {
    sVar3 = this->data[index].super_IString.str._M_len;
    pcVar4 = this->data[index].super_IString.str._M_str;
    lVar7 = index * 0x10;
    while( true ) {
      if (uVar6 - 1 <= index) break;
      index = index + 1;
      puVar1 = (undefined8 *)((long)&this->data[1].super_IString.str._M_len + lVar7);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(this->data->super_IString).str._M_len + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      uVar6 = this->usedElements;
      lVar7 = lVar7 + 0x10;
    }
    resize(this,uVar6 - 1);
    NVar8.super_IString.str._M_str = pcVar4;
    NVar8.super_IString.str._M_len = sVar3;
    return (Name)NVar8.super_IString.str;
  }
  __assert_fail("index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                ,0x17d,
                "T ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::removeAt(size_t) [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
               );
}

Assistant:

T removeAt(size_t index) {
    assert(index < size());
    auto item = data[index];
    for (auto i = index; i < size() - 1; ++i) {
      data[i] = data[i + 1];
    }
    resize(size() - 1);
    return item;
  }